

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_get_kv_int(kvtree *hash,char *key,int val)

{
  kvtree *pkVar1;
  char local_88 [8];
  char tmp [100];
  int val_local;
  char *key_local;
  kvtree *hash_local;
  
  sprintf(local_88,"%d",(ulong)(uint)val);
  pkVar1 = kvtree_get_kv(hash,key,local_88);
  return pkVar1;
}

Assistant:

kvtree* kvtree_get_kv_int(const kvtree* hash, const char* key, int val)
{
  /* TODO: this feels kludgy, but I guess as long as the ASCII string
   * is longer than a max int (or minimum int with leading minus sign)
   * which is 11 chars, we're ok ("-2147483648" to "2147483647") */
  char tmp[100];
  sprintf(tmp, "%d", val);
  return kvtree_get_kv(hash, key, tmp);
}